

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzvec.h
# Opt level: O0

void __thiscall
TPZVec<TPZFMatrix<Fad<double>_>_>::TPZVec
          (TPZVec<TPZFMatrix<Fad<double>_>_> *this,int64_t size,TPZFMatrix<Fad<double>_> *copy)

{
  undefined1 auVar1 [16];
  long lVar2;
  ulong uVar3;
  ulong *puVar4;
  TPZFMatrix<Fad<double>_> *in_RSI;
  undefined8 *in_RDI;
  ulong uVar5;
  TPZFMatrix<Fad<double>_> *in_stack_00000010;
  TPZFMatrix<Fad<double>_> *in_stack_00000018;
  int64_t i;
  ulong *local_60;
  TPZFMatrix<Fad<double>_> *this_00;
  long local_30;
  
  *in_RDI = &PTR__TPZVec_0245deb8;
  in_RDI[1] = 0;
  if ((long)in_RSI < 0) {
    std::operator<<((ostream *)&std::cerr,
                    "TPZVec<TPZFMatrix<Fad<double>>>::TPZVec(const int64_t, const T &) [T = TPZFMatrix<Fad<double>>]"
                   );
    std::operator<<((ostream *)&std::cerr,"Bad parameter size, then size = 0.\n");
    std::ostream::flush();
    in_RDI[2] = 0;
    in_RDI[3] = 0;
  }
  else {
    if (in_RSI != (TPZFMatrix<Fad<double>_> *)0x0) {
      auVar1._8_8_ = 0;
      auVar1._0_8_ = in_RSI;
      uVar3 = SUB168(auVar1 * ZEXT816(0x90),0);
      uVar5 = uVar3 + 8;
      if (SUB168(auVar1 * ZEXT816(0x90),8) != 0 || 0xfffffffffffffff7 < uVar3) {
        uVar5 = 0xffffffffffffffff;
      }
      this_00 = in_RSI;
      puVar4 = (ulong *)operator_new__(uVar5);
      *puVar4 = (ulong)this_00;
      puVar4 = puVar4 + 1;
      if (this_00 != (TPZFMatrix<Fad<double>_> *)0x0) {
        lVar2 = (long)this_00 * 0x12;
        local_60 = puVar4;
        do {
          TPZFMatrix<Fad<double>_>::TPZFMatrix(this_00);
          local_60 = local_60 + 0x12;
        } while (local_60 != puVar4 + lVar2);
      }
      in_RDI[1] = puVar4;
    }
    in_RDI[2] = in_RSI;
    in_RDI[3] = in_RSI;
    for (local_30 = 0; local_30 < (long)in_RSI; local_30 = local_30 + 1) {
      TPZFMatrix<Fad<double>_>::operator=(in_stack_00000018,in_stack_00000010);
    }
  }
  return;
}

Assistant:

TPZVec<T>::TPZVec( const int64_t size, const T& copy ) : fStore( nullptr )
{
#ifndef PZNODEBUG
	if( size < 0 )
	{
		PZError << __PRETTY_FUNCTION__;
        PZError << "Bad parameter size, then size = 0.\n";
		PZError.flush();
		fNElements = 0;
        fNAlloc = 0;
		return;
	}
#endif
	
	if( size )
	{
		fStore = new T[size];
	}
	
	fNElements = size;
    fNAlloc = size;
	
	for( int64_t i = 0; i < size; i++ )
	{
		fStore[i] = copy;
	}
}